

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.cpp
# Opt level: O0

Value * __thiscall luna::StackAPI::GetValue(StackAPI *this,int index)

{
  bool bVar1;
  reference pvVar2;
  int in_ESI;
  long *in_RDI;
  Value *v;
  list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *in_stack_ffffffffffffffd0;
  Value *pVVar3;
  Value *local_20;
  
  bVar1 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::empty
                    ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)(*in_RDI + 0x48));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!state_->calls_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/LibAPI.cpp"
                  ,0x67,"Value *luna::StackAPI::GetValue(int)");
  }
  if (in_ESI < 0) {
    local_20 = (Value *)(*(long *)(in_RDI[1] + 0x18) + (long)in_ESI * 0x10);
  }
  else {
    pvVar2 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::back
                       (in_stack_ffffffffffffffd0);
    local_20 = pvVar2->register_ + in_ESI;
  }
  if ((local_20 < *(Value **)(in_RDI[1] + 0x18)) &&
     (pVVar3 = local_20,
     pvVar2 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::back
                        ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)local_20),
     pvVar2->register_ <= pVVar3)) {
    return local_20;
  }
  return (Value *)0x0;
}

Assistant:

Value * StackAPI::GetValue(int index)
    {
        assert(!state_->calls_.empty());
        Value *v = nullptr;
        if (index < 0)
            v = stack_->top_ + index;
        else
            v = state_->calls_.back().register_ + index;

        if (v >= stack_->top_ || v < state_->calls_.back().register_)
            return nullptr;
        else
            return v;
    }